

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  uchar uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  byte *pbVar15;
  ulong uVar16;
  
  uVar5 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar12 = mode->bitdepth;
    if (uVar12 == 8) {
      if (numpixels != 0) {
        puVar14 = buffer + 3;
        sVar9 = 0;
        do {
          uVar7 = in[sVar9];
          puVar14[-1] = uVar7;
          puVar14[-2] = uVar7;
          puVar14[-3] = uVar7;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar7 = 0xff;
            }
            else {
              uVar7 = -(mode->key_r != (uint)in[sVar9]);
            }
            *puVar14 = uVar7;
          }
          sVar9 = sVar9 + 1;
          puVar14 = puVar14 + uVar5;
        } while (numpixels != sVar9);
      }
    }
    else if (uVar12 == 0x10) {
      if (numpixels != 0) {
        puVar14 = buffer + 3;
        sVar9 = 0;
        do {
          uVar7 = in[sVar9 * 2];
          puVar14[-1] = uVar7;
          puVar14[-2] = uVar7;
          puVar14[-3] = uVar7;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar7 = 0xff;
            }
            else {
              uVar7 = -((uint)(ushort)(*(ushort *)(in + sVar9 * 2) << 8 |
                                      *(ushort *)(in + sVar9 * 2) >> 8) != mode->key_r);
            }
            *puVar14 = uVar7;
          }
          sVar9 = sVar9 + 1;
          puVar14 = puVar14 + uVar5;
        } while (numpixels != sVar9);
      }
    }
    else if (numpixels != 0) {
      sVar9 = 0;
      uVar16 = 0;
      do {
        uVar6 = (ulong)mode->bitdepth;
        uVar13 = 0;
        uVar11 = uVar6;
        if (uVar6 != 0) {
          do {
            uVar10 = uVar16 >> 3;
            bVar1 = (byte)uVar16;
            uVar16 = uVar16 + 1;
            uVar13 = uVar13 + ((uint)((in[uVar10] >> (~bVar1 & 7) & 1) != 0) <<
                              ((byte)(uVar11 - 1) & 0x1f));
            uVar10 = uVar11 - 2;
            uVar11 = uVar11 - 1;
          } while (uVar10 < uVar6);
        }
        uVar7 = (uchar)((uVar13 * 0xff) / (uint)~(-1 << ((byte)uVar12 & 0x1f)));
        buffer[2] = uVar7;
        buffer[1] = uVar7;
        *buffer = uVar7;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar7 = 0xff;
          }
          else {
            uVar7 = -(uVar13 != mode->key_r);
          }
          buffer[3] = uVar7;
        }
        sVar9 = sVar9 + 1;
        buffer = buffer + uVar5;
      } while (sVar9 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar14 = buffer + 3;
        pbVar15 = in + 2;
        do {
          bVar1 = pbVar15[-2];
          puVar14[-3] = bVar1;
          bVar2 = pbVar15[-1];
          puVar14[-2] = bVar2;
          bVar3 = *pbVar15;
          puVar14[-1] = bVar3;
          if (has_alpha != 0) {
            uVar7 = 0xff;
            if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
               (mode->key_g == (uint)bVar2)) {
              uVar7 = -(mode->key_b != (uint)bVar3);
            }
            *puVar14 = uVar7;
          }
          puVar14 = puVar14 + uVar5;
          pbVar15 = pbVar15 + 3;
          numpixels = numpixels - 1;
        } while (numpixels != 0);
      }
    }
    else if (numpixels != 0) {
      puVar14 = buffer + 3;
      do {
        puVar14[-3] = (uchar)*(ushort *)in;
        puVar14[-2] = (uchar)*(ushort *)((long)in + 2);
        uVar4 = *(ushort *)((long)in + 4);
        puVar14[-1] = (uchar)uVar4;
        if (has_alpha != 0) {
          uVar7 = 0xff;
          if (((mode->key_defined != 0) &&
              ((uint)(ushort)(*(ushort *)in << 8 | *(ushort *)in >> 8) == mode->key_r)) &&
             ((uint)(ushort)(*(ushort *)((long)in + 2) << 8 | *(ushort *)((long)in + 2) >> 8) ==
              mode->key_g)) {
            uVar7 = -((uint)CONCAT11((uchar)uVar4,*(undefined1 *)((long)in + 5)) != mode->key_b);
          }
          *puVar14 = uVar7;
        }
        puVar14 = puVar14 + uVar5;
        in = (uchar *)((long)in + 6);
        numpixels = numpixels - 1;
      } while (numpixels != 0);
    }
    break;
  case LCT_PALETTE:
    if (numpixels != 0) {
      sVar9 = 0;
      uVar16 = 0;
      do {
        uVar11 = (ulong)mode->bitdepth;
        if (uVar11 == 8) {
          uVar10 = (ulong)in[sVar9];
        }
        else {
          uVar10 = 0;
          uVar6 = uVar11;
          if (uVar11 != 0) {
            do {
              uVar8 = uVar16 >> 3;
              bVar1 = (byte)uVar16;
              uVar16 = uVar16 + 1;
              uVar10 = (ulong)((int)uVar10 +
                              ((uint)((in[uVar8] >> (~bVar1 & 7) & 1) != 0) <<
                              ((byte)(uVar6 - 1) & 0x1f)));
              uVar8 = uVar6 - 2;
              uVar6 = uVar6 - 1;
            } while (uVar8 < uVar11);
          }
        }
        if (uVar10 < mode->palettesize) {
          uVar12 = (int)uVar10 << 2;
          *buffer = mode->palette[uVar12];
          buffer[1] = mode->palette[(ulong)uVar12 + 1];
          buffer[2] = mode->palette[(ulong)uVar12 + 2];
          if (has_alpha != 0) {
            uVar7 = mode->palette[(ulong)uVar12 + 3];
LAB_001a7556:
            buffer[3] = uVar7;
          }
        }
        else {
          buffer[2] = '\0';
          buffer[0] = '\0';
          buffer[1] = '\0';
          uVar7 = 0xff;
          if (has_alpha != 0) goto LAB_001a7556;
        }
        sVar9 = sVar9 + 1;
        buffer = buffer + uVar5;
      } while (sVar9 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar14 = buffer + 3;
        sVar9 = 0;
        do {
          uVar7 = in[sVar9 * 2];
          puVar14[-1] = uVar7;
          puVar14[-2] = uVar7;
          puVar14[-3] = uVar7;
          if (has_alpha != 0) {
            *puVar14 = in[sVar9 * 2 + 1];
          }
          sVar9 = sVar9 + 1;
          puVar14 = puVar14 + uVar5;
        } while (numpixels != sVar9);
      }
    }
    else if (numpixels != 0) {
      puVar14 = buffer + 3;
      sVar9 = 0;
      do {
        uVar7 = in[sVar9 * 4];
        puVar14[-1] = uVar7;
        puVar14[-2] = uVar7;
        puVar14[-3] = uVar7;
        if (has_alpha != 0) {
          *puVar14 = in[sVar9 * 4 + 2];
        }
        sVar9 = sVar9 + 1;
        puVar14 = puVar14 + uVar5;
      } while (numpixels != sVar9);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar14 = buffer + 3;
        sVar9 = 0;
        do {
          puVar14[-3] = in[sVar9 * 4];
          puVar14[-2] = in[sVar9 * 4 + 1];
          puVar14[-1] = in[sVar9 * 4 + 2];
          if (has_alpha != 0) {
            *puVar14 = in[sVar9 * 4 + 3];
          }
          sVar9 = sVar9 + 1;
          puVar14 = puVar14 + uVar5;
        } while (numpixels != sVar9);
      }
    }
    else if (numpixels != 0) {
      puVar14 = buffer + 3;
      sVar9 = 0;
      do {
        puVar14[-3] = in[sVar9 * 8];
        puVar14[-2] = in[sVar9 * 8 + 2];
        puVar14[-1] = in[sVar9 * 8 + 4];
        if (has_alpha != 0) {
          *puVar14 = in[sVar9 * 8 + 6];
        }
        sVar9 = sVar9 + 1;
        puVar14 = puVar14 + uVar5;
      } while (numpixels != sVar9);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
                                unsigned has_alpha, const unsigned char* in,
                                const LodePNGColorMode* mode)
{
  unsigned num_channels = has_alpha ? 4 : 3;
  size_t i;
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        if(has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
      }
    }
    else if(mode->bitdepth == 16)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        if(has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        if(has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 3 + 0];
        buffer[1] = in[i * 3 + 1];
        buffer[2] = in[i * 3 + 2];
        if(has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
           && buffer[1]== mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        if(has_alpha) buffer[3] = mode->key_defined
           && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
           && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
           && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    size_t j = 0;
    for(i = 0; i != numpixels; ++i, buffer += num_channels)
    {
      if(mode->bitdepth == 8) index = in[i];
      else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

      if(index >= mode->palettesize)
      {
        /*This is an error according to the PNG spec, but most PNG decoders make it black instead.
        Done here too, slightly faster due to no error handling needed.*/
        buffer[0] = buffer[1] = buffer[2] = 0;
        if(has_alpha) buffer[3] = 255;
      }
      else
      {
        buffer[0] = mode->palette[index * 4 + 0];
        buffer[1] = mode->palette[index * 4 + 1];
        buffer[2] = mode->palette[index * 4 + 2];
        if(has_alpha) buffer[3] = mode->palette[index * 4 + 3];
      }
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        if(has_alpha) buffer[3] = in[i * 2 + 1];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        if(has_alpha) buffer[3] = in[i * 4 + 2];
      }
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 4 + 0];
        buffer[1] = in[i * 4 + 1];
        buffer[2] = in[i * 4 + 2];
        if(has_alpha) buffer[3] = in[i * 4 + 3];
      }
    }
    else
    {
      for(i = 0; i != numpixels; ++i, buffer += num_channels)
      {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        if(has_alpha) buffer[3] = in[i * 8 + 6];
      }
    }
  }
}